

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObserverManager.h
# Opt level: O0

void __thiscall
ObserverManager::notify<FooBarProtocol,std::__cxx11::string_const&,char_const*>
          (ObserverManager *this,offset_in_FooBarProtocol_to_subr method,char *args)

{
  pointer ppVar1;
  bool bVar2;
  long *plVar3;
  pair<FooBarProtocol_*,_unsigned_long> pVar4;
  ObserverManager *local_110;
  allocator local_d9;
  string local_d8 [32];
  _Node_iterator_base<std::pair<const_unsigned_long,_void_(*)(BaseObserverProtocol_*)>,_false>
  local_b8;
  _Node_iterator_base<std::pair<const_unsigned_long,_void_(*)(BaseObserverProtocol_*)>,_false>
  local_b0;
  reference local_a8;
  pair<FooBarProtocol_*,_unsigned_long> *p;
  iterator __end0_1;
  iterator __begin0_1;
  vector<std::pair<FooBarProtocol_*,_unsigned_long>,_std::allocator<std::pair<FooBarProtocol_*,_unsigned_long>_>_>
  *__range2_1;
  pair<FooBarProtocol_*,_unsigned_long> local_78;
  reference local_68;
  FooBarProtocol **o;
  iterator __end0;
  iterator __begin0;
  unordered_set<FooBarProtocol_*,_std::hash<FooBarProtocol_*>,_std::equal_to<FooBarProtocol_*>,_std::allocator<FooBarProtocol_*>_>
  *__range2;
  vector<std::pair<FooBarProtocol_*,_unsigned_long>,_std::allocator<std::pair<FooBarProtocol_*,_unsigned_long>_>_>
  observers;
  char *args_local;
  offset_in_FooBarProtocol_to_subr method_local;
  
  observers.
  super__Vector_base<std::pair<FooBarProtocol_*,_unsigned_long>,_std::allocator<std::pair<FooBarProtocol_*,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)args;
  std::
  vector<std::pair<FooBarProtocol_*,_unsigned_long>,_std::allocator<std::pair<FooBarProtocol_*,_unsigned_long>_>_>
  ::vector((vector<std::pair<FooBarProtocol_*,_unsigned_long>,_std::allocator<std::pair<FooBarProtocol_*,_unsigned_long>_>_>
            *)&__range2);
  __end0 = std::
           unordered_set<FooBarProtocol_*,_std::hash<FooBarProtocol_*>,_std::equal_to<FooBarProtocol_*>,_std::allocator<FooBarProtocol_*>_>
           ::begin(&ObserverContainer<FooBarProtocol>::observers);
  o = (FooBarProtocol **)
      std::
      unordered_set<FooBarProtocol_*,_std::hash<FooBarProtocol_*>,_std::equal_to<FooBarProtocol_*>,_std::allocator<FooBarProtocol_*>_>
      ::end(&ObserverContainer<FooBarProtocol>::observers);
  while( true ) {
    bVar2 = std::__detail::operator!=
                      (&__end0.super__Node_iterator_base<FooBarProtocol_*,_false>,
                       (_Node_iterator_base<FooBarProtocol_*,_false> *)&o);
    if (!bVar2) break;
    local_68 = std::__detail::_Node_iterator<FooBarProtocol_*,_true,_false>::operator*(&__end0);
    pVar4 = std::make_pair<FooBarProtocol*const&,unsigned_long&>
                      (local_68,&((*local_68)->super_BaseObserverProtocol).observerId);
    local_78 = pVar4;
    std::
    vector<std::pair<FooBarProtocol_*,_unsigned_long>,_std::allocator<std::pair<FooBarProtocol_*,_unsigned_long>_>_>
    ::push_back((vector<std::pair<FooBarProtocol_*,_unsigned_long>,_std::allocator<std::pair<FooBarProtocol_*,_unsigned_long>_>_>
                 *)&__range2,&local_78);
    std::__detail::_Node_iterator<FooBarProtocol_*,_true,_false>::operator++(&__end0);
  }
  __end0_1 = std::
             vector<std::pair<FooBarProtocol_*,_unsigned_long>,_std::allocator<std::pair<FooBarProtocol_*,_unsigned_long>_>_>
             ::begin((vector<std::pair<FooBarProtocol_*,_unsigned_long>,_std::allocator<std::pair<FooBarProtocol_*,_unsigned_long>_>_>
                      *)&__range2);
  p = (pair<FooBarProtocol_*,_unsigned_long> *)
      std::
      vector<std::pair<FooBarProtocol_*,_unsigned_long>,_std::allocator<std::pair<FooBarProtocol_*,_unsigned_long>_>_>
      ::end((vector<std::pair<FooBarProtocol_*,_unsigned_long>,_std::allocator<std::pair<FooBarProtocol_*,_unsigned_long>_>_>
             *)&__range2);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end0_1,
                       (__normal_iterator<std::pair<FooBarProtocol_*,_unsigned_long>_*,_std::vector<std::pair<FooBarProtocol_*,_unsigned_long>,_std::allocator<std::pair<FooBarProtocol_*,_unsigned_long>_>_>_>
                        *)&p);
    if (!bVar2) break;
    local_a8 = __gnu_cxx::
               __normal_iterator<std::pair<FooBarProtocol_*,_unsigned_long>_*,_std::vector<std::pair<FooBarProtocol_*,_unsigned_long>,_std::allocator<std::pair<FooBarProtocol_*,_unsigned_long>_>_>_>
               ::operator*(&__end0_1);
    local_b0._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_long,_void_(*)(BaseObserverProtocol_*),_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_void_(*)(BaseObserverProtocol_*)>_>_>
         ::find(&unsubscribeMap,&local_a8->second);
    local_b8._M_cur =
         (__node_type *)
         std::
         end<std::unordered_map<unsigned_long,void(*)(BaseObserverProtocol*),std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,void(*)(BaseObserverProtocol*)>>>>
                   (&unsubscribeMap);
    bVar2 = std::__detail::operator==(&local_b0,&local_b8);
    ppVar1 = observers.
             super__Vector_base<std::pair<FooBarProtocol_*,_unsigned_long>,_std::allocator<std::pair<FooBarProtocol_*,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (!bVar2) {
      plVar3 = (long *)((long)&(local_a8->first->super_BaseObserverProtocol).
                               _vptr_BaseObserverProtocol + method);
      local_110 = this;
      if (((ulong)this & 1) != 0) {
        local_110 = *(ObserverManager **)(this + *plVar3 + -1);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d8,(char *)ppVar1,&local_d9);
      (*(code *)local_110)(plVar3,local_d8);
      std::__cxx11::string::~string(local_d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    }
    __gnu_cxx::
    __normal_iterator<std::pair<FooBarProtocol_*,_unsigned_long>_*,_std::vector<std::pair<FooBarProtocol_*,_unsigned_long>,_std::allocator<std::pair<FooBarProtocol_*,_unsigned_long>_>_>_>
    ::operator++(&__end0_1);
  }
  std::
  vector<std::pair<FooBarProtocol_*,_unsigned_long>,_std::allocator<std::pair<FooBarProtocol_*,_unsigned_long>_>_>
  ::~vector((vector<std::pair<FooBarProtocol_*,_unsigned_long>,_std::allocator<std::pair<FooBarProtocol_*,_unsigned_long>_>_>
             *)&__range2);
  return;
}

Assistant:

static void notify(void (P::*method)(MethodArgumentTypes...), ActualArgumentTypes... args) {
        std::vector<std::pair<P*, BaseObserverProtocol::id_t>> observers;
        for (const auto& o : ObserverContainer<P>::observers) {
            observers.push_back(std::make_pair(o, o->observerId));
        }

        for (const auto& p : observers) {
            if (unsubscribeMap.find(p.second) == std::end(unsubscribeMap)) {
                continue;
            }
            (p.first->*method)(args...);
        }
    }